

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_done(connectdata *conn,CURLcode status,_Bool premature)

{
  Curl_easy *data_00;
  void *pvVar1;
  HTTP *http;
  Curl_easy *data;
  _Bool premature_local;
  CURLcode status_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  pvVar1 = (data_00->req).protop;
  (data_00->state).authhost.field_0x18 = (data_00->state).authhost.field_0x18 & 0xfd;
  (data_00->state).authproxy.field_0x18 = (data_00->state).authproxy.field_0x18 & 0xfd;
  Curl_unencode_cleanup(conn);
  conn->seek_func = (data_00->set).seek_func;
  conn->seek_client = (data_00->set).seek_client;
  if (pvVar1 == (void *)0x0) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    if (*(long *)((long)pvVar1 + 0x210) != 0) {
      Curl_add_buffer_free((Curl_send_buffer **)((long)pvVar1 + 0x210));
    }
    Curl_mime_cleanpart((curl_mimepart *)((long)pvVar1 + 0x28));
    conn_local._4_4_ = status;
    if (status == CURLE_OK) {
      if ((((premature) || ((*(uint *)&(conn->bits).field_0x4 >> 0xd & 1) != 0)) ||
          ((*(ulong *)&(data_00->set).field_0x878 >> 0x25 & 1) != 0)) ||
         (0 < ((data_00->req).bytecount + (data_00->req).headerbytecount) -
              (data_00->req).deductheadercount)) {
        conn_local._4_4_ = CURLE_OK;
      }
      else {
        Curl_failf(data_00,"Empty reply from server");
        conn_local._4_4_ = CURLE_GOT_NOTHING;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_http_done(struct connectdata *conn,
                        CURLcode status, bool premature)
{
  struct Curl_easy *data = conn->data;
  struct HTTP *http = data->req.protop;

  /* Clear multipass flag. If authentication isn't done yet, then it will get
   * a chance to be set back to true when we output the next auth header */
  data->state.authhost.multipass = FALSE;
  data->state.authproxy.multipass = FALSE;

  Curl_unencode_cleanup(conn);

  /* set the proper values (possibly modified on POST) */
  conn->seek_func = data->set.seek_func; /* restore */
  conn->seek_client = data->set.seek_client; /* restore */

  if(!http)
    return CURLE_OK;

  if(http->send_buffer) {
    Curl_add_buffer_free(&http->send_buffer);
  }

  Curl_http2_done(conn, premature);

  Curl_mime_cleanpart(&http->form);

  if(status)
    return status;

  if(!premature && /* this check is pointless when DONE is called before the
                      entire operation is complete */
     !conn->bits.retry &&
     !data->set.connect_only &&
     (data->req.bytecount +
      data->req.headerbytecount -
      data->req.deductheadercount) <= 0) {
    /* If this connection isn't simply closed to be retried, AND nothing was
       read from the HTTP server (that counts), this can't be right so we
       return an error here */
    failf(data, "Empty reply from server");
    return CURLE_GOT_NOTHING;
  }

  return CURLE_OK;
}